

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

void Abc_NtkCountInst(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  uint uVar1;
  void *pvVar2;
  int i;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    uVar1 = pNtk->nObjCounts[7];
  }
  else {
    p = pNtk->pDesign->vModules;
    for (i = 0; i < p->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p,i);
      *(undefined4 *)((long)pvVar2 + 0xa8) = 0xffffffff;
    }
    uVar1 = Abc_NtkCountInst_rec(pNtk);
  }
  printf("Instances = %10d.\n",(ulong)uVar1);
  return;
}

Assistant:

void Abc_NtkCountInst( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    int i, Counter;

    if ( pNtk->pDesign == NULL )
        Counter = Abc_NtkNodeNum(pNtk);
    else
    {
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->iStep = -1;
        Counter = Abc_NtkCountInst_rec( pNtk );
    }
    printf( "Instances = %10d.\n", Counter );
}